

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgx_dec.c
# Opt level: O0

int pgx_getc(jas_stream_t *in)

{
  byte *pbVar1;
  int iVar2;
  bool local_35;
  uint local_34;
  uint local_30;
  uint local_2c;
  uint local_28;
  uint local_24;
  uint local_20;
  int c;
  jas_stream_t *in_local;
  
  do {
    if ((in->flags_ & 7U) == 0) {
      if ((in->rwlimit_ < 0) || (in->rwcnt_ < in->rwlimit_)) {
        iVar2 = in->cnt_ + -1;
        in->cnt_ = iVar2;
        if (iVar2 < 0) {
          local_24 = jas_stream_fillbuf(in,1);
        }
        else {
          in->rwcnt_ = in->rwcnt_ + 1;
          pbVar1 = in->ptr_;
          in->ptr_ = pbVar1 + 1;
          local_24 = (uint)*pbVar1;
        }
        local_20 = local_24;
      }
      else {
        in->flags_ = in->flags_ | 4;
        local_20 = 0xffffffff;
      }
      local_28 = local_20;
    }
    else {
      local_28 = 0xffffffff;
    }
    if (local_28 == 0xffffffff) {
      return -1;
    }
    if (local_28 != 0x23) {
      return local_28;
    }
    do {
      if ((in->flags_ & 7U) == 0) {
        if ((in->rwlimit_ < 0) || (in->rwcnt_ < in->rwlimit_)) {
          iVar2 = in->cnt_ + -1;
          in->cnt_ = iVar2;
          if (iVar2 < 0) {
            local_30 = jas_stream_fillbuf(in,1);
          }
          else {
            in->rwcnt_ = in->rwcnt_ + 1;
            pbVar1 = in->ptr_;
            in->ptr_ = pbVar1 + 1;
            local_30 = (uint)*pbVar1;
          }
          local_2c = local_30;
        }
        else {
          in->flags_ = in->flags_ | 4;
          local_2c = 0xffffffff;
        }
        local_34 = local_2c;
      }
      else {
        local_34 = 0xffffffff;
      }
      if (local_34 == 0xffffffff) {
        return -1;
      }
      local_35 = local_34 != 10 && local_34 != 0xd;
    } while (local_35);
  } while( true );
}

Assistant:

static int pgx_getc(jas_stream_t *in)
{
	int c;
	for (;;) {
		if ((c = jas_stream_getc(in)) == EOF) {
			return -1;
		}
		if (c != '#') {
			return c;
		}
		do {
			if ((c = jas_stream_getc(in)) == EOF) {
				return -1;
			}
		} while (c != '\n' && c != '\r');
	}
}